

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib-flate.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  size_t sVar5;
  ostream *poVar6;
  string *psVar7;
  char *pcVar8;
  char *pcVar9;
  shared_ptr<Pl_Flate> sVar10;
  bool warn;
  action_e action;
  shared_ptr<Pl_Flate> flate;
  shared_ptr<Pl_StdioFile> out;
  _Any_data local_2758;
  code *local_2748;
  code *local_2740;
  uchar buf [10000];
  
  pcVar8 = *argv;
  pcVar3 = strrchr(pcVar8,0x2f);
  pcVar9 = pcVar3 + 1;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = pcVar8;
  }
  whoami = pcVar9;
  if (argc == 2) {
    pcVar8 = argv[1];
    iVar2 = strcmp(pcVar8,"--version");
    if (iVar2 == 0) goto LAB_001035f6;
    action = a_inflate;
    iVar2 = strcmp(pcVar8,"-uncompress");
    if (iVar2 == 0) {
LAB_001034ea:
      warn = false;
      QUtil::binary_stdout();
      QUtil::binary_stdin();
      Pl_Flate::zopfli_check_env((QPDFLogger *)0x0);
      std::make_shared<Pl_StdioFile,char_const(&)[7],_IO_FILE*&>
                ((char (*) [7])&out,(_IO_FILE **)"stdout");
      buf._0_8_ = out.super___shared_ptr<Pl_StdioFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      sVar10 = std::make_shared<Pl_Flate,char_const(&)[6],Pl_StdioFile*,Pl_Flate::action_e&>
                         ((char (*) [6])&flate,(Pl_StdioFile **)"flate",(action_e *)buf);
      local_2758._8_8_ = 0;
      local_2758._M_unused._M_object = &warn;
      local_2740 = std::
                   _Function_handler<void_(const_char_*,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/zlib-flate/zlib-flate.cc:69:32)>
                   ::_M_invoke;
      local_2748 = std::
                   _Function_handler<void_(const_char_*,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/zlib-flate/zlib-flate.cc:69:32)>
                   ::_M_manager;
      Pl_Flate::setWarnCallback
                (flate.super___shared_ptr<Pl_Flate,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_2758,
                 sVar10.super___shared_ptr<Pl_Flate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                 _M_pi);
      std::_Function_base::~_Function_base((_Function_base *)&local_2758);
      do {
        sVar5 = fread(buf,1,10000,_stdin);
        if (sVar5 == 0) break;
        (**(code **)(*(long *)flate.super___shared_ptr<Pl_Flate,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    + 0x10))
                  (flate.super___shared_ptr<Pl_Flate,_(__gnu_cxx::_Lock_policy)2>._M_ptr,buf,sVar5);
      } while (sVar5 != 0);
      (**(code **)(*(long *)flate.super___shared_ptr<Pl_Flate,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                  0x18))();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&flate.super___shared_ptr<Pl_Flate,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&out.super___shared_ptr<Pl_StdioFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if (warn == false) {
        return 0;
      }
      exit(3);
    }
    iVar2 = strcmp(pcVar8,"-compress");
    if (iVar2 == 0) {
      action = a_deflate;
      goto LAB_001034ea;
    }
    iVar2 = strncmp(pcVar8,"-compress=",10);
    if (iVar2 == 0) {
      action = a_deflate;
      iVar2 = QUtil::string_to_int(pcVar8 + 10);
      Pl_Flate::setCompressionLevel(iVar2);
      goto LAB_001034ea;
    }
    iVar2 = strcmp(pcVar8,"--_zopfli");
    if (iVar2 == 0) {
      cVar1 = Pl_Flate::zopfli_supported();
      pcVar8 = "0";
      pcVar9 = "0";
      if (cVar1 != '\0') {
        pcVar9 = "1";
      }
      poVar4 = std::operator<<((ostream *)&std::cout,pcVar9);
      cVar1 = Pl_Flate::zopfli_enabled();
      if (cVar1 != '\0') {
        pcVar8 = "1";
      }
      poVar4 = std::operator<<(poVar4,pcVar8);
      std::endl<char,std::char_traits<char>>(poVar4);
      return 0;
    }
  }
  usage();
LAB_001035f6:
  poVar4 = std::operator<<((ostream *)&std::cout,pcVar9);
  poVar6 = std::operator<<(poVar4," from qpdf version ");
  psVar7 = (string *)QPDF::QPDFVersion_abi_cxx11_((QPDF *)poVar4);
  poVar4 = std::operator<<(poVar6,psVar7);
  std::endl<char,std::char_traits<char>>(poVar4);
  exit(0);
}

Assistant:

int
main(int argc, char* argv[])
{
    if ((whoami = strrchr(argv[0], '/')) == nullptr) {
        whoami = argv[0];
    } else {
        ++whoami;
    }

    if ((argc == 2) && (strcmp(argv[1], "--version") == 0)) {
        std::cout << whoami << " from qpdf version " << QPDF::QPDFVersion() << std::endl;
        exit(0);
    }

    if (argc != 2) {
        usage();
    }

    Pl_Flate::action_e action = Pl_Flate::a_inflate;

    if ((strcmp(argv[1], "-uncompress") == 0)) {
        // okay
    } else if ((strcmp(argv[1], "-compress") == 0)) {
        action = Pl_Flate::a_deflate;
    } else if ((strncmp(argv[1], "-compress=", 10) == 0)) {
        action = Pl_Flate::a_deflate;
        int level = QUtil::string_to_int(argv[1] + 10);
        Pl_Flate::setCompressionLevel(level);
    } else if (strcmp(argv[1], "--_zopfli") == 0) {
        // Undocumented option, but that doesn't mean someone doesn't use it...
        // This is primarily here to support the test suite.
        std::cout << (Pl_Flate::zopfli_supported() ? "1" : "0")
                  << (Pl_Flate::zopfli_enabled() ? "1" : "0") << std::endl;
        return 0;
    } else {
        usage();
    }

    bool warn = false;
    try {
        QUtil::binary_stdout();
        QUtil::binary_stdin();
        Pl_Flate::zopfli_check_env();
        auto out = std::make_shared<Pl_StdioFile>("stdout", stdout);
        auto flate = std::make_shared<Pl_Flate>("flate", out.get(), action);
        flate->setWarnCallback([&warn](char const* msg, int code) {
            warn = true;
            std::cerr << whoami << ": WARNING: zlib code " << code << ", msg = " << msg
                      << std::endl;
        });

        unsigned char buf[10000];
        bool done = false;
        while (!done) {
            size_t len = fread(buf, 1, sizeof(buf), stdin);
            if (len <= 0) {
                done = true;
            } else {
                flate->write(buf, len);
            }
        }
        flate->finish();
    } catch (std::exception& e) {
        std::cerr << whoami << ": " << e.what() << std::endl;
        exit(2);
    }

    if (warn) {
        exit(3);
    }
    return 0;
}